

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void free_svm_model(svm_model *model)

{
  svm_example **ppsVar1;
  ulong *in_RDI;
  svm_example *unaff_retaddr;
  size_t i;
  v_array<svm_example_*> *this;
  
  for (this = (v_array<svm_example_*> *)0x0; this < (v_array<svm_example_*> *)*in_RDI;
      this = (v_array<svm_example_*> *)((long)&this->_begin + 1)) {
    v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(in_RDI + 1),(size_t)this);
    svm_example::~svm_example(unaff_retaddr);
    v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(in_RDI + 1),(size_t)this);
    free_it((void *)0x2c46a7);
    ppsVar1 = v_array<svm_example_*>::operator[]
                        ((v_array<svm_example_*> *)(in_RDI + 1),(size_t)this);
    *ppsVar1 = (svm_example *)0x0;
  }
  v_array<svm_example_*>::delete_v(this);
  v_array<float>::delete_v((v_array<float> *)this);
  v_array<float>::delete_v((v_array<float> *)this);
  free(in_RDI);
  return;
}

Assistant:

void free_svm_model(svm_model* model)
{
  for (size_t i = 0; i < model->num_support; i++)
  {
    model->support_vec[i]->~svm_example();
    // Warning C6001 is triggered by the following:
    // example is allocated using (a) '&calloc_or_throw<svm_example>()' and freed using (b)
    // 'free(model->support_vec[i])'
    //
    // When the call to allocation is replaced by (a) 'new svm_example()' and deallocated using (b) 'operator delete
    // (model->support_vect[i])', the warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(model->support_vec[i]);
    //  #pragma warning(default:6001)

    model->support_vec[i] = 0;
  }

  model->support_vec.delete_v();
  model->alpha.delete_v();
  model->delta.delete_v();
  free(model);
}